

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryBuilder::readNames(WasmBinaryBuilder *this,size_t payloadLen)

{
  char **this_00;
  pointer puVar1;
  __uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> _Var2;
  Module *pMVar3;
  pointer puVar4;
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> _Var5;
  pointer puVar6;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var7;
  pointer puVar8;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var9;
  pointer puVar10;
  __uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true> _Var11;
  pointer puVar12;
  __uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true> _Var13;
  __uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
  _Var14;
  pointer pHVar15;
  pointer puVar16;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> _Var17;
  WasmBinaryBuilder *this_01;
  bool bVar18;
  bool bVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  ostream *poVar22;
  size_t sVar23;
  mapped_type *pmVar24;
  mapped_type *pmVar25;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *p_Var26;
  ulong uVar27;
  ulong uVar28;
  pointer puVar29;
  size_t i;
  _Head_base<0UL,_wasm::Function_*,_false> this_02;
  Name NVar30;
  string_view sVar31;
  string local_168;
  string local_148;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_128;
  size_t local_120;
  ulong local_118;
  size_t local_110;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_108;
  ulong local_100;
  undefined1 local_f8 [8];
  Name rawLocalName;
  Name rawName;
  string local_c8;
  allocator<char> local_a2;
  allocator<char> local_a1;
  undefined1 local_a0 [8];
  uint32_t fieldIndex;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  WasmBinaryBuilder *local_78;
  uint32_t local_6c;
  undefined1 auStack_68 [4];
  uint32_t localIndex;
  NameProcessor processor;
  
  local_110 = payloadLen;
  bVar18 = isDebugEnabled("binary");
  if (bVar18) {
    std::operator<<((ostream *)&std::cerr,"== readNames\n");
  }
  uVar27 = this->pos;
  local_110 = local_110 + uVar27;
  local_100 = 0;
  local_78 = this;
  do {
    if (local_110 <= uVar27) {
      if (uVar27 == local_110) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"bad names section position change",
                 (allocator<char> *)auStack_68);
      throwError(local_78,&local_148);
    }
    uVar20 = getU32LEB(this);
    if (uVar20 <= (uint)local_100 && (uint)local_100 != 0) {
      poVar22 = std::operator<<((ostream *)&std::cerr,"warning: out-of-order name subsection: ");
      poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
      std::endl<char,std::char_traits<char>>(poVar22);
    }
    local_100 = (ulong)uVar20;
    uVar21 = getU32LEB(this);
    local_120 = this->pos;
    local_118 = (ulong)uVar21;
    switch(uVar20) {
    case 0:
      sVar31 = (string_view)getInlineString(this);
      (this->wasm->name).super_IString.str = sVar31;
      goto LAB_009f24a7;
    case 1:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar10 = (this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3)) {
          _Var11.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
          super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
               puVar10[uVar20]._M_t.
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
          *(IString *)
           _Var11.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl = NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var11.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: function index out of bounds in name section, function subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 2:
      uVar20 = getU32LEB(this);
      local_128 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(ulong)uVar20;
      p_Var26 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)0x0;
      while (p_Var26 != local_128) {
        local_108 = p_Var26;
        uVar20 = getU32LEB(this);
        puVar10 = (this->wasm->functions).
                  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3)) {
          this_02._M_head_impl =
               *(Function **)
                &puVar10[uVar20]._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: function index out of bounds in name section, local subsection: "
                                   );
          std::__cxx11::to_string((string *)auStack_68,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)auStack_68);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)auStack_68);
          this_02._M_head_impl = (Function *)0x0;
        }
        uVar20 = getU32LEB(this);
        _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
        processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
        processor.usedNames._M_h._M_bucket_count = 0;
        processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
        processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
        processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
        uVar27 = (ulong)uVar20;
        local_80 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)((long)this_02._M_head_impl + 0x70);
        while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
          local_6c = getU32LEB(this);
          _local_f8 = (string_view)getInlineString(this);
          if ((_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
              this_02._M_head_impl != (Function *)0x0) {
            sVar31 = (string_view)
                     NameProcessor::process((NameProcessor *)auStack_68,(Name)_local_f8);
            if (sVar31._M_len == 0) {
              poVar22 = std::operator<<((ostream *)&std::cerr,"warning: empty local name at index ")
              ;
              std::__cxx11::to_string((string *)local_a0,local_6c);
              poVar22 = std::operator<<(poVar22,(string *)local_a0);
              poVar22 = std::operator<<(poVar22," in function ");
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((string *)&local_c8,
                         (basic_string_view<char,_std::char_traits<char>_> *)this_02._M_head_impl,
                         (allocator<char> *)&rawLocalName.super_IString.str._M_str);
              this = local_78;
              poVar22 = std::operator<<(poVar22,(string *)&local_c8);
              std::endl<char,std::char_traits<char>>(poVar22);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string((string *)local_a0);
            }
            else {
              uVar28 = (ulong)local_6c;
              sVar23 = Function::getNumLocals(this_02._M_head_impl);
              if (uVar28 < sVar23) {
                pmVar25 = std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[](local_80,&local_6c);
                (pmVar25->super_IString).str = sVar31;
                this = local_78;
              }
              else {
                poVar22 = std::operator<<((ostream *)&std::cerr,
                                          "warning: local index out of bounds in name section, local subsection: "
                                         );
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)local_a0,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_f8,&local_a2);
                poVar22 = std::operator<<(poVar22,(string *)local_a0);
                poVar22 = std::operator<<(poVar22," at index ");
                std::__cxx11::to_string(&local_c8,local_6c);
                poVar22 = std::operator<<(poVar22,(string *)&local_c8);
                poVar22 = std::operator<<(poVar22," in function ");
                this_00 = &rawLocalName.super_IString.str._M_str;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)this_00,
                           (basic_string_view<char,_std::char_traits<char>_> *)this_02._M_head_impl,
                           &local_a1);
                poVar22 = std::operator<<(poVar22,(string *)this_00);
                std::endl<char,std::char_traits<char>>(poVar22);
                std::__cxx11::string::~string((string *)&rawLocalName.super_IString.str._M_str);
                std::__cxx11::string::~string((string *)&local_c8);
                std::__cxx11::string::~string((string *)local_a0);
                this = local_78;
              }
            }
          }
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)auStack_68);
        p_Var26 = local_108 + 1;
      }
      goto LAB_009f24a7;
    default:
      poVar22 = std::operator<<((ostream *)&std::cerr,"warning: unknown name subsection with id ");
      std::__cxx11::to_string((string *)auStack_68,(uint)local_100);
      poVar22 = std::operator<<(poVar22,(string *)auStack_68);
      poVar22 = std::operator<<(poVar22," at ");
      poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
      std::endl<char,std::char_traits<char>>(poVar22);
      std::__cxx11::string::~string((string *)auStack_68);
      this->pos = local_120 + local_118;
      goto LAB_009f24a7;
    case 4:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        sVar31 = (string_view)
                 NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        pHVar15 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->types).
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3)) {
          pmVar24 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->wasm->typeNames,pHVar15 + uVar20);
          (pmVar24->name).super_IString.str = sVar31;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: type index out of bounds in name section, type subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 5:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      local_80 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)(ulong)uVar20;
      for (p_Var26 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)0x0; p_Var26 != local_80; p_Var26 = p_Var26 + 1) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        pMVar3 = this->wasm;
        puVar4 = (pMVar3->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(pMVar3->tables).
                          super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3)) {
          _Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
               puVar4[uVar20]._M_t.
               super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>;
          puVar6 = (pMVar3->elementSegments).
                   super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar29 = (pMVar3->elementSegments).
                         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar6;
              puVar29 = puVar29 + 1) {
            _Var7._M_head_impl =
                 (puVar29->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
            if (*(char **)((long)&(_Var7._M_head_impl)->table + 8) ==
                *(char **)((long)_Var5.
                                 super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                 .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 8)) {
              ((_Var7._M_head_impl)->table).super_IString = NVar30.super_IString.str;
            }
          }
          *(IString *)
           _Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl = NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var5.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                  super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: table index out of bounds in name section, table subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 6:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar8 = (this->wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->memories).
                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3)) {
          _Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
          super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
               puVar8[uVar20]._M_t.
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
          *(IString *)
           _Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var9.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: memory index out of bounds in name section, memory subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 7:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar12 = (this->wasm->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->globals).
                          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12 >> 3)) {
          _Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl =
               puVar12[uVar20]._M_t.
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>;
          *(IString *)
           _Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl = NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var13.super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
                  _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: global index out of bounds in name section, global subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 8:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar29 = (this->wasm->elementSegments).
                  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->elementSegments).
                          super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar29 >> 3)) {
          _Var14.
          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
          _M_t.
          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
               puVar29[uVar20]._M_t.
               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
          ;
          *(IString *)
           _Var14.
           super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>.
           _M_t.
           super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
           .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
               NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var14.
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: elem index out of bounds in name section, elem subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 9:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      local_80 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)(ulong)uVar20;
      for (p_Var26 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)0x0; local_80 != p_Var26; p_Var26 = p_Var26 + 1) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar16 = (this->wasm->dataSegments).
                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->dataSegments).
                          super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3)) {
          _Var17.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
          super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
               puVar16[(long)p_Var26]._M_t.
               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>;
          *(IString *)
           _Var17.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
           .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
               NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var17.
                  super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                  .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: data index out of bounds in name section, data subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
      break;
    case 10:
      uVar20 = getU32LEB(this);
      local_108 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)(ulong)uVar20;
      p_Var26 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)0x0;
      while (p_Var26 != local_108) {
        local_80 = p_Var26;
        uVar20 = getU32LEB(this);
        uVar27 = (ulong)uVar20;
        pHVar15 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (uVar27 < (ulong)((long)(this->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar15 >> 3))
        {
          bVar19 = HeapType::isStruct(pHVar15 + uVar27);
          bVar18 = true;
          if (!bVar19) goto LAB_009f229a;
        }
        else {
LAB_009f229a:
          std::operator<<((ostream *)&std::cerr,
                          "warning: invalid field index in name field section\n");
          bVar18 = false;
        }
        uVar20 = getU32LEB(this);
        _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
        processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
        processor.usedNames._M_h._M_bucket_count = 0;
        processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
        processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
        processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
        uVar28 = (ulong)uVar20;
        while (this_01 = local_78, bVar19 = uVar28 != 0, uVar28 = uVar28 - 1, bVar19) {
          local_a0._0_4_ = getU32LEB(local_78);
          NVar30 = getInlineString(this_01);
          sVar31 = (string_view)NameProcessor::process((NameProcessor *)auStack_68,NVar30);
          if (bVar18) {
            pmVar24 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&local_78->wasm->typeNames,
                                   (local_78->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar27);
            pmVar25 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&pmVar24->fieldNames,(key_type *)local_a0);
            (pmVar25->super_IString).str = sVar31;
          }
        }
        std::
        _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)auStack_68);
        this = local_78;
        p_Var26 = local_80 + 1;
      }
      goto LAB_009f24a7;
    case 0xb:
      uVar20 = getU32LEB(this);
      _auStack_68 = (pointer)&processor.usedNames._M_h._M_rehash_policy._M_next_resize;
      processor.usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
      processor.usedNames._M_h._M_bucket_count = 0;
      processor.usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      processor.usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
      processor.usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      processor.usedNames._M_h._M_rehash_policy._4_4_ = 0;
      processor.usedNames._M_h._M_rehash_policy._M_next_resize = 0;
      uVar27 = (ulong)uVar20;
      while (bVar18 = uVar27 != 0, uVar27 = uVar27 - 1, bVar18) {
        uVar20 = getU32LEB(this);
        join_0x00000010_0x00000000_ = (string_view)getInlineString(this);
        NVar30 = NameProcessor::process
                           ((NameProcessor *)auStack_68,(Name)join_0x00000010_0x00000000_);
        puVar1 = (this->wasm->tags).
                 super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)uVar20 <
            (ulong)((long)(this->wasm->tags).
                          super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
          _Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
          super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
          super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
               puVar1[uVar20]._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>
          ;
          *(IString *)
           _Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = NVar30.super_IString.str;
          *(undefined1 *)
           ((long)_Var2.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                  super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10) = 1;
        }
        else {
          poVar22 = std::operator<<((ostream *)&std::cerr,
                                    "warning: tag index out of bounds in name section, tag subsection: "
                                   );
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((string *)local_a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &rawLocalName.super_IString.str._M_str,(allocator<char> *)local_f8);
          poVar22 = std::operator<<(poVar22,(string *)local_a0);
          poVar22 = std::operator<<(poVar22," at index ");
          std::__cxx11::to_string(&local_c8,uVar20);
          poVar22 = std::operator<<(poVar22,(string *)&local_c8);
          std::endl<char,std::char_traits<char>>(poVar22);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)local_a0);
        }
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_68);
LAB_009f24a7:
    uVar27 = local_120 + local_118;
    if (this->pos != uVar27) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"bad names subsection position change",
                 (allocator<char> *)auStack_68);
      throwError(local_78,&local_168);
    }
  } while( true );
}

Assistant:

void WasmBinaryBuilder::readNames(size_t payloadLen) {
  BYN_TRACE("== readNames\n");
  auto sectionPos = pos;
  uint32_t lastType = 0;
  while (pos < sectionPos + payloadLen) {
    auto nameType = getU32LEB();
    if (lastType && nameType <= lastType) {
      std::cerr << "warning: out-of-order name subsection: " << nameType
                << std::endl;
    }
    lastType = nameType;
    auto subsectionSize = getU32LEB();
    auto subsectionPos = pos;
    using Subsection = BinaryConsts::CustomSections::Subsection;
    if (nameType == Subsection::NameModule) {
      wasm.name = getInlineString();
    } else if (nameType == Subsection::NameFunction) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.functions.size()) {
          wasm.functions[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: function index out of bounds in name section, "
                       "function subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameLocal) {
      auto numFuncs = getU32LEB();
      for (size_t i = 0; i < numFuncs; i++) {
        auto funcIndex = getU32LEB();
        Function* func = nullptr;
        if (funcIndex < wasm.functions.size()) {
          func = wasm.functions[funcIndex].get();
        } else {
          std::cerr
            << "warning: function index out of bounds in name section, local "
               "subsection: "
            << std::to_string(funcIndex) << std::endl;
        }
        auto numLocals = getU32LEB();
        NameProcessor processor;
        for (size_t j = 0; j < numLocals; j++) {
          auto localIndex = getU32LEB();
          auto rawLocalName = getInlineString();
          if (!func) {
            continue; // read and discard in case of prior error
          }
          auto localName = processor.process(rawLocalName);
          if (localName.size() == 0) {
            std::cerr << "warning: empty local name at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          } else if (localIndex < func->getNumLocals()) {
            func->localNames[localIndex] = localName;
          } else {
            std::cerr << "warning: local index out of bounds in name "
                         "section, local subsection: "
                      << std::string(rawLocalName.str) << " at index "
                      << std::to_string(localIndex) << " in function "
                      << std::string(func->name.str) << std::endl;
          }
        }
      }
    } else if (nameType == Subsection::NameType) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < types.size()) {
          wasm.typeNames[types[index]].name = name;
        } else {
          std::cerr << "warning: type index out of bounds in name section, "
                       "type subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameTable) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.tables.size()) {
          auto* table = wasm.tables[index].get();
          for (auto& segment : wasm.elementSegments) {
            if (segment->table == table->name) {
              segment->table = name;
            }
          }
          table->setExplicitName(name);
        } else {
          std::cerr << "warning: table index out of bounds in name section, "
                       "table subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameElem) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);

        if (index < wasm.elementSegments.size()) {
          wasm.elementSegments[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: elem index out of bounds in name section, "
                       "elem subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameMemory) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.memories.size()) {
          wasm.memories[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: memory index out of bounds in name section, "
                       "memory subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameData) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.dataSegments.size()) {
          wasm.dataSegments[i]->setExplicitName(name);
        } else {
          std::cerr << "warning: data index out of bounds in name section, "
                       "data subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameGlobal) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.globals.size()) {
          wasm.globals[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: global index out of bounds in name section, "
                       "global subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else if (nameType == Subsection::NameField) {
      auto numTypes = getU32LEB();
      for (size_t i = 0; i < numTypes; i++) {
        auto typeIndex = getU32LEB();
        bool validType =
          typeIndex < types.size() && types[typeIndex].isStruct();
        if (!validType) {
          std::cerr << "warning: invalid field index in name field section\n";
        }
        auto numFields = getU32LEB();
        NameProcessor processor;
        for (size_t i = 0; i < numFields; i++) {
          auto fieldIndex = getU32LEB();
          auto rawName = getInlineString();
          auto name = processor.process(rawName);
          if (validType) {
            wasm.typeNames[types[typeIndex]].fieldNames[fieldIndex] = name;
          }
        }
      }
    } else if (nameType == Subsection::NameTag) {
      auto num = getU32LEB();
      NameProcessor processor;
      for (size_t i = 0; i < num; i++) {
        auto index = getU32LEB();
        auto rawName = getInlineString();
        auto name = processor.process(rawName);
        if (index < wasm.tags.size()) {
          wasm.tags[index]->setExplicitName(name);
        } else {
          std::cerr << "warning: tag index out of bounds in name section, "
                       "tag subsection: "
                    << std::string(rawName.str) << " at index "
                    << std::to_string(index) << std::endl;
        }
      }
    } else {
      std::cerr << "warning: unknown name subsection with id "
                << std::to_string(nameType) << " at " << pos << std::endl;
      pos = subsectionPos + subsectionSize;
    }
    if (pos != subsectionPos + subsectionSize) {
      throwError("bad names subsection position change");
    }
  }
  if (pos != sectionPos + payloadLen) {
    throwError("bad names section position change");
  }
}